

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err http_copy_data(nni_http_entity *entity,void *data,size_t size)

{
  nng_err nVar1;
  nng_err rv;
  size_t size_local;
  void *data_local;
  nni_http_entity *entity_local;
  
  nVar1 = http_alloc_data(entity,size);
  if (nVar1 == NNG_OK) {
    memcpy(entity->data,data,size);
  }
  return nVar1;
}

Assistant:

static nng_err
http_copy_data(nni_http_entity *entity, const void *data, size_t size)
{
	nng_err rv;
	if ((rv = http_alloc_data(entity, size)) == 0) {
		memcpy(entity->data, data, size);
	}
	return (rv);
}